

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O3

int If_CutSopBalanceEval(If_Man_t *p,If_Cut_t *pCut,Vec_Int_t *vAig)

{
  uint uVar1;
  float fVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  ulong uVar8;
  int Area;
  int pTimes [15];
  uint local_5c;
  int local_58 [16];
  
  uVar7 = *(uint *)&pCut->field_0x1c | 0x2000;
  *(uint *)&pCut->field_0x1c = uVar7;
  if (vAig != (Vec_Int_t *)0x0) {
    vAig->nSize = 0;
    uVar7 = *(uint *)&pCut->field_0x1c;
  }
  if (uVar7 < 0x1000000) {
    uVar5 = pCut->iCutFunc;
    if (-1 < (int)uVar5) {
      if (uVar5 < 2) {
        if (vAig != (Vec_Int_t *)0x0) {
          Vec_IntPush(vAig,uVar5);
          uVar7 = *(uint *)&pCut->field_0x1c;
        }
        *(uint *)&pCut->field_0x1c = uVar7 & 0xfffff000;
        return 0;
      }
      __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0xff,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
    }
  }
  else {
    uVar5 = uVar7 >> 0x18;
    if (uVar5 == 1) {
      if (-1 < pCut->iCutFunc) {
        if ((pCut->iCutFunc & 0x7ffffffeU) != 2) {
          __assert_fail("Abc_Lit2Var(If_CutTruthLit(pCut)) == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0x107,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
        }
        if (vAig == (Vec_Int_t *)0x0) {
          *(uint *)&pCut->field_0x1c = uVar7 & 0x1fff000;
        }
        else {
          Vec_IntPush(vAig,0);
          if (pCut->iCutFunc < 0) goto LAB_0041db5d;
          Vec_IntPush(vAig,pCut->iCutFunc & 1);
          uVar7 = *(uint *)&pCut->field_0x1c;
          *(uint *)&pCut->field_0x1c = uVar7 & 0xfffff000;
          if (uVar7 < 0x1000000) {
            __assert_fail("i >= 0 && i < (int)pCut->nLeaves",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                          ,0x19b,"If_Obj_t *If_CutLeaf(If_Man_t *, If_Cut_t *, int)");
          }
        }
        fVar2 = pCut[1].Area;
        if ((-1 < (long)(int)fVar2) && ((int)fVar2 < p->vObjs->nSize)) {
          return (int)*(float *)((long)p->vObjs->pArray[(int)fVar2] + 0x5c);
        }
LAB_0041db3e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
    else {
      uVar1 = pCut->iCutFunc;
      if (-1 < (int)uVar1) {
        if (p->vTtIsops[uVar5]->nSize <= (int)(uVar1 >> 1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar6 = p->vTtIsops[uVar5]->pArray;
        local_5c = 0;
        if (pVVar6 == (Vec_Int_t *)0x0) {
          return -1;
        }
        pVVar6 = pVVar6 + (uVar1 >> 1);
        if (pVVar6->nSize < 1) {
          __assert_fail("Vec_IntSize(vCover) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0x117,"int If_CutSopBalanceEval(If_Man_t *, If_Cut_t *, Vec_Int_t *)");
        }
        pVVar3 = p->vObjs;
        uVar8 = 0;
        while( true ) {
          fVar2 = (&pCut[1].Area)[uVar8];
          if (((long)(int)fVar2 < 0) || (pVVar3->nSize <= (int)fVar2)) break;
          local_58[uVar8] = (int)*(float *)((long)pVVar3->pArray[(int)fVar2] + 0x5c);
          uVar8 = uVar8 + 1;
          if (uVar5 == uVar8) {
            iVar4 = If_CutSopBalanceEvalIntInt
                              (pVVar6,uVar5,local_58,vAig,(uVar7 >> 0xc ^ uVar1) & 1,
                               (int *)&local_5c);
            *(uint *)&pCut->field_0x1c = *(uint *)&pCut->field_0x1c & 0xfffff000 | local_5c & 0xfff;
            return iVar4;
          }
        }
        goto LAB_0041db3e;
      }
    }
  }
LAB_0041db5d:
  __assert_fail("pCut->iCutFunc >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
}

Assistant:

int If_CutSopBalanceEval( If_Man_t * p, If_Cut_t * pCut, Vec_Int_t * vAig )
{
    pCut->fUser = 1;
    if ( vAig )
        Vec_IntClear( vAig );
    if ( pCut->nLeaves == 0 ) // const
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) );
        pCut->Cost = 0;
        return 0;
    }
    if ( pCut->nLeaves == 1 ) // variable
    {
        assert( Abc_Lit2Var(If_CutTruthLit(pCut)) == 1 );
        if ( vAig )
            Vec_IntPush( vAig, 0 );
        if ( vAig )
            Vec_IntPush( vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) );
        pCut->Cost = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        int fVerbose = 0;
        Vec_Int_t * vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
        int Delay, Area = 0;
        int i, pTimes[IF_MAX_FUNC_LUTSIZE];
        if ( vCover == NULL )
            return -1;
        assert( Vec_IntSize(vCover) > 0 );
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
            pTimes[i] = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay; 
        Delay = If_CutSopBalanceEvalIntInt( vCover, If_CutLeaveNum(pCut), pTimes, vAig, Abc_LitIsCompl(If_CutTruthLit(pCut)) ^ pCut->fCompl, &Area );
        pCut->Cost = Area;
        if ( fVerbose )
        {
            int Max = 0, Two = 0;
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                Max = Abc_MaxInt( Max, pTimes[i] );
            for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                if ( pTimes[i] != Max )
                    Two = Abc_MaxInt( Two, pTimes[i] );
            if ( Two + 2 < Max && Max + 3 < Delay )
            {
                for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
                    printf( "%3d ", pTimes[i] );
                for ( ; i < p->pPars->nLutSize; i++ )
                    printf( "    " );
                printf( "-> %3d   ", Delay );
                Dau_DsdPrintFromTruth( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut) );
                Kit_TruthIsopPrintCover( vCover, If_CutLeaveNum(pCut), Abc_LitIsCompl(If_CutTruthLit(pCut)) ^ pCut->fCompl );
                {
                    Vec_Int_t vIsop;
                    int pIsop[64];
                    vIsop.nCap = vIsop.nSize = Abc_Tt6Esop( *If_CutTruthW(p, pCut), pCut->nLeaves, pIsop );
                    vIsop.pArray = pIsop;
                    printf( "ESOP (%d -> %d)\n", Vec_IntSize(vCover), vIsop.nSize );
                    Kit_TruthIsopPrintCover( &vIsop, If_CutLeaveNum(pCut), 0 );
                }
                printf( "\n" );
            }
        }
        return Delay;
    }
}